

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O3

bool __thiscall covenant::CFG::isOneLevelIndirectionTerminal(CFG *this,Sym *s)

{
  pointer pvVar1;
  int iVar2;
  pointer pPVar3;
  long lVar4;
  ulong uVar5;
  pointer pSVar6;
  bool bVar7;
  ulong uVar8;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_48;
  
  bVar7 = true;
  if ((s->x & 1U) != 0) {
    iVar2 = s->x >> 1;
    pvVar1 = (this->prods).
             super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pPVar3 = pvVar1[iVar2].
             super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar1[iVar2].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data + 8) != pPVar3) {
      uVar8 = 0;
      do {
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  (&local_48,
                   (this->rules).
                   super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + pPVar3[uVar8].rule);
        uVar5 = 0;
        pSVar6 = local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          do {
            uVar5 = uVar5 + (~pSVar6->x & 1);
            pSVar6 = pSVar6 + 1;
          } while (pSVar6 != local_48.
                             super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
          uVar5 = uVar5 & 0xffffffff;
        }
        lVar4 = (long)local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        bVar7 = (bool)(bVar7 & uVar5 == lVar4 >> 2);
        uVar8 = (ulong)((int)uVar8 + 1);
        pvVar1 = (this->prods).
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar3 = pvVar1[iVar2].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar8 < (ulong)((long)*(pointer *)
                                      ((long)&pvVar1[iVar2].
                                              super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                              ._M_impl.super__Vector_impl_data + 8) - (long)pPVar3
                              >> 2));
    }
  }
  return bVar7;
}

Assistant:

bool isVar()  const  { return this->x&1; }